

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

bool __thiscall
test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
          (runner *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cond,char *expr,char *file,int line,char *func,char *msg)

{
  bool bVar1;
  char *func_local;
  int line_local;
  char *file_local;
  char *expr_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *cond_local;
  runner *this_local;
  
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(cond);
  if (bVar1) {
    (*this->_vptr_runner[6])(this,expr,file,(ulong)(uint)line,func);
    if (msg != (char *)0x0) {
      (*this->_vptr_runner[4])(this,msg);
    }
    this_local._7_1_ = false;
  }
  else {
    (*this->_vptr_runner[5])(this,expr,file,(ulong)(uint)line,func);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
  maybe_fail(
      Bool cond,
      char const* expr,
      char const* file,
      int line,
      char const* func,
      char const* msg = nullptr)
  {
    if(!!cond)
    {
      pass(expr, file, line, func);
      return true;
    }
    fail(expr, file, line, func);
    if(msg)
      note(msg);
    return false;
  }